

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

bool __thiscall Vector::compare(Vector *this,void *ptr,void *other)

{
  ulong uVar1;
  Type *pTVar2;
  long lVar3;
  ulong uVar4;
  reference pvVar5;
  reference pvVar6;
  ulong local_68;
  size_t i;
  uint8_t *base_b;
  uint8_t *base_a;
  size_t element_size;
  Type *element_t;
  size_t element_count;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *b_ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *a_ptr;
  void *other_local;
  void *ptr_local;
  Vector *this_local;
  
  uVar1 = (**(code **)(*(long *)this + 200))(this,ptr);
  pTVar2 = (Type *)Typelib::Indirect::getIndirection();
  lVar3 = Typelib::Type::getSize();
  uVar4 = (**(code **)(*(long *)this + 200))(this,other);
  if (uVar1 == uVar4) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ptr,0);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)other,0);
    for (local_68 = 0; local_68 < uVar1; local_68 = local_68 + 1) {
      uVar4 = Typelib::compare(pvVar5 + local_68 * lVar3,pvVar6 + local_68 * lVar3,pTVar2);
      if ((uVar4 & 1) == 0) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Vector::compare(void* ptr, void* other) const
{
    std::vector<uint8_t>* a_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(ptr);
    std::vector<uint8_t>* b_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(other);

    size_t   element_count = getElementCount(a_ptr);
    Type const& element_t  = getIndirection();
    size_t   element_size  = element_t.getSize();
    if (element_count != getElementCount(b_ptr))
        return false;

    uint8_t* base_a = &(*a_ptr)[0];
    uint8_t* base_b = &(*b_ptr)[0];
    for (size_t i = 0; i < element_count; ++i)
    {
        /// !!! We don't use element_layout here as comparing requires a
        // different layout. If performance becomes an issue, we'll have to
        // precompute both
        if (!Typelib::compare(
                    base_a + i * element_size,
                    base_b + i * element_size, element_t))
            return false;
    }
    return true;
}